

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_clib.c
# Opt level: O3

char * clib_check_lds(lua_State *L,char *buf)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  GCstr *pGVar4;
  byte bVar5;
  size_t lenx;
  
  iVar1 = strncmp(buf,"GROUP",5);
  if (((iVar1 == 0) || (iVar1 = strncmp(buf,"INPUT",5), iVar1 == 0)) &&
     (pcVar2 = strchr(buf,0x28), pcVar2 != (char *)0x0)) {
    do {
      pcVar3 = pcVar2;
      bVar5 = pcVar3[1];
      pcVar2 = pcVar3 + 1;
    } while (bVar5 == 0x20);
    lenx = 0;
    while ((0x29 < bVar5 || ((0x20100000001U >> ((ulong)bVar5 & 0x3f) & 1) == 0))) {
      bVar5 = pcVar3[lenx + 2];
      lenx = lenx + 1;
    }
    pGVar4 = lj_str_new(L,pcVar3 + 1,lenx);
    return (char *)(pGVar4 + 1);
  }
  return (char *)0x0;
}

Assistant:

static const char *clib_check_lds(lua_State *L, const char *buf)
{
  char *p, *e;
  if ((!strncmp(buf, "GROUP", 5) || !strncmp(buf, "INPUT", 5)) &&
      (p = strchr(buf, '('))) {
    while (*++p == ' ') ;
    for (e = p; *e && *e != ' ' && *e != ')'; e++) ;
    return strdata(lj_str_new(L, p, e-p));
  }
  return NULL;
}